

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_fidb(CPUS390XState_conflict *env,uint64_t f2,uint32_t m34)

{
  int iVar1;
  float64 fVar2;
  uintptr_t unaff_retaddr;
  
  iVar1 = s390_swap_bfp_rounding_mode(env,m34 & 0xf);
  fVar2 = float64_round_to_int_s390x(f2,&env->fpu_status);
  (env->fpu_status).float_rounding_mode = (char)iVar1;
  handle_exceptions(env,SUB41((m34 & 0x40) >> 6,0),unaff_retaddr);
  return fVar2;
}

Assistant:

uint64_t HELPER(fidb)(CPUS390XState *env, uint64_t f2, uint32_t m34)
{
    int old_mode = s390_swap_bfp_rounding_mode(env, round_from_m34(m34));
    float64 ret = float64_round_to_int(f2, &env->fpu_status);

    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_exceptions(env, xxc_from_m34(m34), GETPC());
    return ret;
}